

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclablePromiseObjectDisplay::RecyclablePromiseObjectDisplay
          (RecyclablePromiseObjectDisplay *this,ResolvedObject *resolvedObject)

{
  ResolvedObject *resolvedObject_local;
  RecyclablePromiseObjectDisplay *this_local;
  
  RecyclableObjectDisplay::RecyclableObjectDisplay
            (&this->super_RecyclableObjectDisplay,resolvedObject,0);
  (this->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay._vptr_IDiagObjectModelDisplay
       = (_func_int **)&PTR_Name_01deb038;
  return;
}

Assistant:

RecyclablePromiseObjectDisplay::RecyclablePromiseObjectDisplay(ResolvedObject* resolvedObject)
        : RecyclableObjectDisplay(resolvedObject)
    {
    }